

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_sqrt_mips(floatx80 a,float_status *status)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint64_t uVar3;
  undefined8 extraout_RDX;
  floatx80 fVar4;
  floatx80 fVar5;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 b;
  uint64_t local_a8;
  uint64_t term3;
  uint64_t term2;
  uint64_t term1;
  uint64_t term0;
  uint64_t rem3;
  uint64_t rem2;
  uint64_t rem1;
  uint64_t rem0;
  uint64_t doubleZSig0;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t aSig1;
  uint64_t aSig0;
  uint local_38;
  int32_t zExp;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  a_00._10_6_ = 0;
  a_00.low = (long)a._0_10_;
  a_00.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var1 = floatx80_invalid_encoding(a_00);
  if (_Var1) {
    float_raise_mips('\x01',_aExp);
    fVar4 = floatx80_default_nan_mips(_aExp);
    a_local.low._0_2_ = fVar4.high;
    goto LAB_0090c76e;
  }
  a_01.high = (uint16_t)a_local.low;
  a_01.low = (uint64_t)status_local;
  a_01._10_6_ = 0;
  aSig1 = extractFloatx80Frac(a_01);
  a_02.high = (uint16_t)a_local.low;
  a_02.low = (uint64_t)status_local;
  a_02._10_6_ = 0;
  local_38 = extractFloatx80Exp(a_02);
  a_03.high = (uint16_t)a_local.low;
  a_03.low = (uint64_t)status_local;
  a_03._10_6_ = 0;
  zExp._3_1_ = extractFloatx80Sign(a_03);
  if (local_38 == 0x7fff) {
    if ((aSig1 & 0x7fffffffffffffff) != 0) {
      a_04.high = (uint16_t)a_local.low;
      a_04.low = (uint64_t)status_local;
      b.high = (uint16_t)a_local.low;
      b.low = (uint64_t)status_local;
      a_04._10_6_ = 0;
      b._10_6_ = 0;
      fVar4 = propagateFloatx80NaN_mips(a_04,b,_aExp);
      a_local.low._0_2_ = fVar4.high;
      goto LAB_0090c76e;
    }
    if (zExp._3_1_ == '\0') {
      fVar4._8_8_ = extraout_RDX;
      fVar4.low = (uint64_t)status_local;
      goto LAB_0090c76e;
    }
  }
  else {
    if (zExp._3_1_ == '\0') {
      if (local_38 == 0) {
        if (aSig1 == 0) {
          fVar4 = packFloatx80('\0',0,0);
          a_local.low._0_2_ = fVar4.high;
          goto LAB_0090c76e;
        }
        normalizeFloatx80Subnormal_mips(aSig1,(int32_t *)&local_38,&aSig1);
      }
      aSig0._4_4_ = ((int)(local_38 - 0x3fff) >> 1) + 0x3fff;
      uVar2 = estimateSqrt32(local_38,(uint32_t)(aSig1 >> 0x20));
      zSig1 = (uint64_t)uVar2;
      shift128Right(aSig1,0,(local_38 & 1) + 2,&aSig1,&zSig0);
      uVar3 = estimateDiv128To64(aSig1,zSig0,zSig1 << 0x20);
      zSig1 = uVar3 + zSig1 * 0x40000000;
      rem0 = zSig1 * 2;
      mul64To128(zSig1,zSig1,&term1,&term2);
      sub128(aSig1,zSig0,term1,term2,&rem1,&rem2);
      while ((long)rem1 < 0) {
        zSig1 = zSig1 - 1;
        rem0 = rem0 - 2;
        add128(rem1,rem2,zSig1 >> 0x3f,rem0 | 1,&rem1,&rem2);
      }
      doubleZSig0 = estimateDiv128To64(rem2,0,rem0);
      if ((doubleZSig0 & 0x3fffffffffffffff) < 6) {
        if (doubleZSig0 == 0) {
          doubleZSig0 = 1;
        }
        mul64To128(rem0,doubleZSig0,&term2,&term3);
        sub128(rem2,0,term2,term3,&rem2,&rem3);
        mul64To128(doubleZSig0,doubleZSig0,&term3,&local_a8);
        sub192(rem2,rem3,0,0,term3,local_a8,&rem2,&rem3,&term0);
        while ((long)rem2 < 0) {
          doubleZSig0 = doubleZSig0 - 1;
          shortShift128Left(0,doubleZSig0,1,&term3,&local_a8);
          local_a8 = local_a8 | 1;
          term3 = rem0 | term3;
          add192(rem2,rem3,term0,0,term3,local_a8,&rem2,&rem3,&term0);
        }
        doubleZSig0 = (long)(int)(uint)((rem2 != 0 || rem3 != 0) || term0 != 0) | doubleZSig0;
      }
      shortShift128Left(0,doubleZSig0,1,&zSig1,&doubleZSig0);
      zSig1 = rem0 | zSig1;
      fVar4 = roundAndPackFloatx80_mips
                        (_aExp->floatx80_rounding_precision,'\0',aSig0._4_4_,zSig1,doubleZSig0,_aExp
                        );
      a_local.low._0_2_ = fVar4.high;
      goto LAB_0090c76e;
    }
    if (local_38 == 0 && aSig1 == 0) {
      fVar4._8_8_ = extraout_RDX;
      fVar4.low = (uint64_t)status_local;
      goto LAB_0090c76e;
    }
  }
  float_raise_mips('\x01',_aExp);
  fVar4 = floatx80_default_nan_mips(_aExp);
  a_local.low._0_2_ = fVar4.high;
LAB_0090c76e:
  a_local._8_8_ = fVar4.low;
  fVar5._10_6_ = fVar4._10_6_;
  fVar5.high = (uint16_t)a_local.low;
  fVar5.low = a_local._8_8_;
  return fVar5;
}

Assistant:

floatx80 floatx80_sqrt(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig0 << 1)) {
            return propagateFloatx80NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( aSig0 == 0 ) return packFloatx80( 0, 0, 0 );
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFF;
    zSig0 = estimateSqrt32( aExp, aSig0>>32 );
    shift128Right( aSig0, 0, 2 + ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & UINT64_C(0x3FFFFFFFFFFFFFFF) ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shortShift128Left( 0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= doubleZSig0;
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                0, zExp, zSig0, zSig1, status);
}